

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_fpassthru(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  io_private *pDev;
  jx9_value *pObj;
  int iVar1;
  jx9_int64 jVar2;
  uint uVar3;
  void *pvVar4;
  char zBuf [8192];
  char acStack_2028 [8192];
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (pDev = (io_private *)((*apArg)->x).pOther, pDev == (io_private *)0x0)) ||
     (pDev->iMagic != 0xfeac14)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Expecting an IO handle");
    uVar3 = 8;
    pvVar4 = (void *)0x0;
  }
  else if (pDev->pStream == (jx9_io_stream *)0x0) {
    pvVar4 = (void *)0x0;
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,"null_stream");
    uVar3 = 8;
  }
  else {
    pvVar4 = (void *)0x0;
    uVar3 = 2;
    do {
      jVar2 = StreamRead(pDev,acStack_2028,0x2000);
      if (jVar2 < 1) break;
      pvVar4 = (void *)((long)pvVar4 + jVar2);
      iVar1 = jx9_context_output(pCtx,acStack_2028,(int)pvVar4);
    } while (iVar1 != -10);
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).pOther = pvVar4;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | uVar3;
  return 0;
}

Assistant:

static int jx9Builtin_fpassthru(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_int64 n, nRead;
	char zBuf[8192];
	int rc;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nRead = 0;
	for(;;){
		n = StreamRead(pDev, zBuf, sizeof(zBuf));
		if( n < 1 ){
			/* Error or EOF */
			break;
		}
		/* Increment the read counter */
		nRead += n;
		/* Output data */
		rc = jx9_context_output(pCtx, zBuf, (int)nRead /* FIXME: 64-bit issues */);
		if( rc == JX9_ABORT ){
			/* Consumer callback request an operation abort */
			break;
		}
	}
	/* Total number of bytes readen */
	jx9_result_int64(pCtx, nRead);
	return JX9_OK;
}